

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classifier.cpp
# Opt level: O2

string * __thiscall
GNB::predict_abi_cxx11_
          (string *__return_storage_ptr__,GNB *this,vector<double,_std::allocator<double>_> *sample)

{
  double dVar1;
  pointer pbVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [272];
  
  dVar10 = *(sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start - mean_left_s;
  local_128._0_8_ =
       exp((-dVar10 * dVar10) / (stddev_left_s * stddev_left_s + stddev_left_s * stddev_left_s));
  dVar10 = stddev_left_s * stddev_left_s * 6.283185307179586;
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  dVar11 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[1] - mean_left_d;
  local_128._8_8_ =
       exp((-dVar11 * dVar11) / (stddev_left_d * stddev_left_d + stddev_left_d * stddev_left_d));
  dVar11 = stddev_left_s * stddev_left_s * 6.283185307179586;
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  dVar12 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[2] - mean_left_s_dot;
  local_138._0_8_ =
       exp((-dVar12 * dVar12) /
           (stddev_left_s_dot * stddev_left_s_dot + stddev_left_s_dot * stddev_left_s_dot));
  dVar12 = stddev_left_s_dot * stddev_left_s_dot * 6.283185307179586;
  if (dVar12 < 0.0) {
    dVar12 = sqrt(dVar12);
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  dVar13 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[3] - mean_left_d_dot;
  local_138._8_8_ =
       exp((-dVar13 * dVar13) /
           (stddev_left_d_dot * stddev_left_d_dot + stddev_left_d_dot * stddev_left_d_dot));
  dVar13 = stddev_left_d_dot * stddev_left_d_dot * 6.283185307179586;
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  dVar24 = p_left;
  dVar14 = *(sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start - mean_keep_s;
  dVar14 = exp((-dVar14 * dVar14) / (stddev_keep_s * stddev_keep_s + stddev_keep_s * stddev_keep_s))
  ;
  dVar15 = stddev_keep_s * stddev_keep_s * 6.283185307179586;
  if (dVar15 < 0.0) {
    dVar15 = sqrt(dVar15);
  }
  else {
    dVar15 = SQRT(dVar15);
  }
  dVar16 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[1] - mean_keep_d;
  dVar16 = exp((-dVar16 * dVar16) / (stddev_keep_d * stddev_keep_d + stddev_keep_d * stddev_keep_d))
  ;
  dVar3 = stddev_keep_s * stddev_keep_s * 6.283185307179586;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar17 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[2] - mean_keep_s_dot;
  dVar17 = exp((-dVar17 * dVar17) /
               (stddev_keep_s_dot * stddev_keep_s_dot + stddev_keep_s_dot * stddev_keep_s_dot));
  dVar18 = stddev_keep_s_dot * stddev_keep_s_dot * 6.283185307179586;
  if (dVar18 < 0.0) {
    dVar18 = sqrt(dVar18);
  }
  else {
    dVar18 = SQRT(dVar18);
  }
  dVar19 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[3] - mean_keep_d_dot;
  dVar19 = exp((-dVar19 * dVar19) /
               (stddev_keep_d_dot * stddev_keep_d_dot + stddev_keep_d_dot * stddev_keep_d_dot));
  dVar4 = stddev_keep_d_dot * stddev_keep_d_dot * 6.283185307179586;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar1 = p_keep;
  dVar20 = *(sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start - mean_right_s;
  local_148._0_8_ =
       exp((-dVar20 * dVar20) / (stddev_right_s * stddev_right_s + stddev_right_s * stddev_right_s))
  ;
  dVar20 = stddev_right_s * stddev_right_s * 6.283185307179586;
  if (dVar20 < 0.0) {
    dVar20 = sqrt(dVar20);
  }
  else {
    dVar20 = SQRT(dVar20);
  }
  dVar21 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[1] - mean_right_d;
  local_148._8_8_ =
       exp((-dVar21 * dVar21) / (stddev_right_d * stddev_right_d + stddev_right_d * stddev_right_d))
  ;
  dVar21 = stddev_right_s * stddev_right_s * 6.283185307179586;
  if (dVar21 < 0.0) {
    dVar21 = sqrt(dVar21);
  }
  else {
    dVar21 = SQRT(dVar21);
  }
  dVar22 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[2] - mean_right_s_dot;
  dVar22 = exp((-dVar22 * dVar22) /
               (stddev_right_s_dot * stddev_right_s_dot + stddev_right_s_dot * stddev_right_s_dot));
  dVar23 = stddev_right_s_dot * stddev_right_s_dot * 6.283185307179586;
  if (dVar23 < 0.0) {
    dVar23 = sqrt(dVar23);
  }
  else {
    dVar23 = SQRT(dVar23);
  }
  auVar5._8_8_ = dVar11;
  auVar5._0_8_ = dVar10;
  auVar5 = divpd(local_128._0_16_,auVar5);
  auVar6._8_8_ = dVar13;
  auVar6._0_8_ = dVar12;
  auVar6 = divpd(local_138,auVar6);
  dVar10 = (sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[3] - mean_right_d_dot;
  auVar7._8_8_ = dVar21;
  auVar7._0_8_ = dVar20;
  auVar7 = divpd(local_148,auVar7);
  dVar10 = exp((-dVar10 * dVar10) /
               (stddev_right_d_dot * stddev_right_d_dot + stddev_right_d_dot * stddev_right_d_dot));
  dVar11 = stddev_right_d_dot * stddev_right_d_dot * 6.283185307179586;
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  auVar26._8_8_ = dVar10;
  auVar26._0_8_ = dVar22;
  auVar27._8_8_ = dVar11;
  auVar27._0_8_ = dVar23;
  auVar27 = divpd(auVar26,auVar27);
  local_128._0_8_ = auVar5._0_8_;
  local_128._8_8_ = auVar5._8_8_;
  local_148._0_8_ = auVar7._0_8_;
  local_148._8_8_ = auVar7._8_8_;
  local_138._0_8_ = auVar6._0_8_;
  local_138._8_8_ = auVar6._8_8_;
  dVar24 = dVar24 * (double)local_138._8_8_ *
                    (double)local_138._0_8_ * (double)local_128._8_8_ * (double)local_128._0_8_;
  if (p_right * auVar27._8_8_ * auVar27._0_8_ * (double)local_148._8_8_ * (double)local_148._0_8_ <=
      dVar24) {
    auVar25._8_8_ = dVar16;
    auVar25._0_8_ = dVar14;
    auVar8._8_8_ = dVar3;
    auVar8._0_8_ = dVar15;
    auVar5 = divpd(auVar25,auVar8);
    auVar28._8_8_ = dVar19;
    auVar28._0_8_ = dVar17;
    auVar9._8_8_ = dVar4;
    auVar9._0_8_ = dVar18;
    auVar7 = divpd(auVar28,auVar9);
    pbVar2 = (this->possible_labels).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (dVar1 * auVar7._8_8_ * auVar5._8_8_ * auVar5._0_8_ * auVar7._0_8_ <= dVar24)
    goto LAB_00104768;
  }
  else {
    pbVar2 = (this->possible_labels).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  pbVar2 = pbVar2 + 1;
LAB_00104768:
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar2);
  return __return_storage_ptr__;
}

Assistant:

string GNB::predict(const vector<double> &sample)
{
  /**
   * Once trained, this method is called and expected to return 
   *   a predicted behavior for the given observation.
   * @param observation - a 4 tuple with s, d, s_dot, d_dot.
   *   - Example: [3.5, 0.1, 8.5, -0.2]
   * @output A label representing the best guess of the classifier. Can
   *   be one of "left", "keep" or "right".
   *
   * TODO: Complete this function to return your classifier's prediction
   */
  double prob_s;
  double prob_left = 1;
  double prob_keep = 1;
  double prob_right = 1;

  // prob of s being left * prob of d being left * prob of sdot being left * prob of ddot being left
  // prob of s being keep * prob of d being keep * prob of sdot being keep * prob of ddot being keep
  // prob of s being right * prob of d being right * prob of sdot being right * prob of ddot being right
  // Once you have all these probs, find the max one out of them.

  // prob of being left
  prob_s = exp(-1 * pow(sample[0] - mean_left_s, 2) / (2 * pow(stddev_left_s, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_left_s, 2));
  prob_left *= prob_s;

  prob_s = exp(-1 * pow(sample[1] - mean_left_d, 2) / (2 * pow(stddev_left_d, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_left_s, 2));
  prob_left *= prob_s;

  prob_s = exp(-1 * pow(sample[2] - mean_left_s_dot, 2) / (2 * pow(stddev_left_s_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_left_s_dot, 2));
  prob_left *= prob_s;

  prob_s = exp(-1 * pow(sample[3] - mean_left_d_dot, 2) / (2 * pow(stddev_left_d_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_left_d_dot, 2));
  prob_left *= prob_s;
  prob_left *= p_left;

  // prob of being keep
  prob_s = exp(-1 * pow(sample[0] - mean_keep_s, 2) / (2 * pow(stddev_keep_s, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_keep_s, 2));
  prob_keep *= prob_s;

  prob_s = exp(-1 * pow(sample[1] - mean_keep_d, 2) / (2 * pow(stddev_keep_d, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_keep_s, 2));
  prob_keep *= prob_s;

  prob_s = exp(-1 * pow(sample[2] - mean_keep_s_dot, 2) / (2 * pow(stddev_keep_s_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_keep_s_dot, 2));
  prob_keep *= prob_s;

  prob_s = exp(-1 * pow(sample[3] - mean_keep_d_dot, 2) / (2 * pow(stddev_keep_d_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_keep_d_dot, 2));
  prob_keep *= prob_s;
  prob_keep *= p_keep;

  // prob of being right
  prob_s = exp(-1 * pow(sample[0] - mean_right_s, 2) / (2 * pow(stddev_right_s, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_right_s, 2));
  prob_right *= prob_s;

  prob_s = exp(-1 * pow(sample[1] - mean_right_d, 2) / (2 * pow(stddev_right_d, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_right_s, 2));
  prob_right *= prob_s;

  prob_s = exp(-1 * pow(sample[2] - mean_right_s_dot, 2) / (2 * pow(stddev_right_s_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_right_s_dot, 2));
  prob_right *= prob_s;

  prob_s = exp(-1 * pow(sample[3] - mean_right_d_dot, 2) / (2 * pow(stddev_right_d_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_right_d_dot, 2));
  prob_right *= prob_s;
  prob_right *= p_right;

  if (prob_left >= prob_right)
  {
    if (prob_left >= prob_keep)
    {
      return this->possible_labels[0];
    }
    else
    {
      return this->possible_labels[1];
    }
  }
  else
  {
    return this->possible_labels[1];
  }
}